

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall
cmConfigureLog::WriteValue
          (cmConfigureLog *this,string_view key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map)

{
  ofstream *poVar1;
  StreamWriter *pSVar2;
  int iVar3;
  long lVar4;
  _Base_ptr p_Var5;
  string_view key_00;
  Value local_58;
  
  if (WriteValue(std::basic_string_view<char,std::char_traits<char>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::rawKeyChars_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&WriteValue(std::basic_string_view<char,std::char_traits<char>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                                 ::rawKeyChars_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &WriteValue(std::basic_string_view<char,std::char_traits<char>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                  ::rawKeyChars_abi_cxx11_,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                 (allocator<char> *)&local_58);
      __cxa_atexit(std::__cxx11::string::~string,
                   &WriteValue(std::basic_string_view<char,std::char_traits<char>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::rawKeyChars_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&WriteValue(std::basic_string_view<char,std::char_traits<char>>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                           ::rawKeyChars_abi_cxx11_);
    }
  }
  BeginObject(this,key);
  poVar1 = &this->Stream;
  for (p_Var5 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(map->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    lVar4 = std::__cxx11::string::find_first_not_of((string *)(p_Var5 + 1),0x9b97b8);
    if (lVar4 == -1) {
      key_00._M_str = *(char **)(p_Var5 + 1);
      key_00._M_len = (size_t)p_Var5[1]._M_parent;
      WriteValue(this,key_00,(string *)(p_Var5 + 2));
    }
    else {
      BeginLine(this);
      pSVar2 = (this->Encoder)._M_t.
               super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>.
               _M_t.
               super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>
               .super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
      Json::Value::Value(&local_58,(String *)(p_Var5 + 1));
      (*pSVar2->_vptr_StreamWriter[2])(pSVar2,&local_58,poVar1);
      Json::Value::~Value(&local_58);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,": ");
      pSVar2 = (this->Encoder)._M_t.
               super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>.
               _M_t.
               super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>
               .super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
      Json::Value::Value(&local_58,(String *)(p_Var5 + 2));
      (*pSVar2->_vptr_StreamWriter[2])(pSVar2,&local_58,poVar1);
      Json::Value::~Value(&local_58);
      std::endl<char,std::char_traits<char>>
                (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
    }
  }
  EndObject(this);
  return;
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key,
                                std::map<std::string, std::string> const& map)
{
  static const std::string rawKeyChars = //
    "ABCDEFGHIJKLMNOPQRSTUVWXYZ"         //
    "abcdefghijklmnopqrstuvwxyz"         //
    "0123456789"                         //
    "-_"                                 //
    ;
  this->BeginObject(key);
  for (auto const& entry : map) {
    if (entry.first.find_first_not_of(rawKeyChars) == std::string::npos) {
      this->WriteValue(entry.first, entry.second);
    } else {
      this->BeginLine();
      this->Encoder->write(entry.first, &this->Stream);
      this->Stream << ": ";
      this->Encoder->write(entry.second, &this->Stream);
      this->EndLine();
    }
  }
  this->EndObject();
}